

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O1

void fiobj_hash_dealloc(FIOBJ o,_func_void_FIOBJ_void_ptr *task,void *arg)

{
  void *ptr;
  ulong uVar1;
  ulong uVar2;
  
  ptr = (void *)(o & 0xfffffffffffffff8);
  uVar1 = *(ulong *)((long)ptr + 0x20);
  if ((uVar1 != 0) &&
     (uVar1 < (ulong)(*(long *)((long)ptr + 0x18) * 0x18 + *(long *)((long)ptr + 0x20)))) {
    do {
      if (*(long *)(uVar1 + 8) != 0) {
        (*task)(*(FIOBJ *)(uVar1 + 0x10),arg);
      }
      fiobj_free(*(FIOBJ *)(uVar1 + 8));
      uVar2 = uVar1 + 0x18;
      *(undefined8 *)(uVar1 + 8) = 0;
      *(undefined8 *)(uVar1 + 0x10) = 0;
      uVar1 = uVar2;
    } while (uVar2 < (ulong)(*(long *)((long)ptr + 0x18) * 0x18 + *(long *)((long)ptr + 0x20)));
  }
  *(undefined8 *)((long)ptr + 8) = 0;
  fio_hash___free((fio_hash___s *)((long)ptr + 8));
  fio_free(ptr);
  return;
}

Assistant:

static void fiobj_hash_dealloc(FIOBJ o, void (*task)(FIOBJ, void *),
                               void *arg) {
  FIO_SET_FOR_LOOP(&obj2hash(o)->hash, i) {
    if (i->obj.key)
      task((FIOBJ)i->obj.obj, arg);
    fiobj_free((FIOBJ)i->obj.key);
    i->obj.key = FIOBJ_INVALID;
    i->obj.obj = FIOBJ_INVALID;
  }
  obj2hash(o)->hash.count = 0;
  fio_hash___free(&obj2hash(o)->hash);
  fio_free(FIOBJ2PTR(o));
}